

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::end__vertex_weights(LibraryControllersLoader *this)

{
  this->mCurrentInputParent = INPUT_PARENT_UNKNOWN;
  this->mJointOffset = 0;
  this->mWeightsOffset = 0;
  this->mCurrentMaxOffset = 0;
  this->mCurrentOffset = 0;
  return true;
}

Assistant:

bool LibraryControllersLoader::end__vertex_weights()
	{
		mCurrentInputParent = INPUT_PARENT_UNKNOWN;
		mJointOffset = 0;
		mWeightsOffset = 0;
		mCurrentMaxOffset = 0;
		mCurrentOffset = 0;
		return true;
	}